

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O3

void av1_k_means_dim1(int16_t *data,int16_t *centroids,uint8_t *indices,int n,int k,int max_itr)

{
  byte bVar1;
  int16_t *__s1;
  int16_t iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint8_t *puVar7;
  uint uVar8;
  uint uVar9;
  int64_t this_dist;
  int16_t *meta_centroids [2];
  uint8_t *meta_indices [2];
  int16_t centroids_tmp [8];
  int count [8];
  int centroids_sum [8];
  uint8_t indices_tmp [4096];
  uint local_1104;
  long local_10d8;
  ulong local_10d0;
  int16_t *local_10c8 [3];
  size_t local_10b0;
  size_t local_10a8;
  long local_10a0;
  uint8_t *local_1098 [2];
  undefined1 local_1088 [16];
  int local_1078 [16];
  undefined1 local_1038 [4104];
  
  local_10c8[1] = (int16_t *)local_1088;
  local_1098[1] = local_1038;
  local_10c8[0] = centroids;
  local_1098[0] = indices;
  (*av1_calc_indices_dim1)(data,centroids,indices,&local_10d8,n,k);
  lVar6 = (long)k;
  if (max_itr < 1) {
    uVar5 = 0;
    iVar4 = 0;
  }
  else {
    local_10a8 = lVar6 * 4;
    local_10b0 = lVar6 * 2;
    local_1104 = 0;
    uVar5 = 0;
    puVar7 = indices;
    iVar3 = 0;
    do {
      iVar4 = iVar3;
      local_10a0 = local_10d8;
      local_10d0 = (ulong)((uint)uVar5 ^ 1);
      __s1 = local_10c8[local_10d0];
      local_1078[4] = 0;
      local_1078[5] = 0;
      local_1078[6] = 0;
      local_1078[7] = 0;
      local_1078[0] = 0;
      local_1078[1] = 0;
      local_1078[2] = 0;
      local_1078[3] = 0;
      uVar8 = (uint)*data;
      memset(local_1078 + 8,0,local_10a8);
      if (0 < n) {
        uVar5 = 0;
        do {
          bVar1 = puVar7[uVar5];
          local_1078[bVar1] = local_1078[bVar1] + 1;
          local_1078[(ulong)bVar1 + 8] = local_1078[(ulong)bVar1 + 8] + (int)data[uVar5];
          uVar5 = uVar5 + 1;
        } while ((uint)n != uVar5);
      }
      if (0 < k) {
        uVar5 = 0;
        do {
          iVar3 = local_1078[uVar5];
          if (iVar3 == 0) {
            uVar8 = uVar8 * 0x41c64e6d + 0x3039;
            iVar2 = data[(ulong)(uVar8 >> 0x10 & 0x7fff) % (ulong)(uint)n];
          }
          else {
            iVar2 = (int16_t)(((iVar3 >> 1) + local_1078[uVar5 + 8]) / iVar3);
          }
          __s1[uVar5] = iVar2;
          uVar5 = uVar5 + 1;
        } while ((uint)k != uVar5);
      }
      iVar3 = bcmp(__s1,local_10c8[local_1104],local_10b0);
      uVar5 = local_10d0;
      uVar8 = 0;
      if (iVar3 == 0) goto LAB_001e07e8;
      puVar7 = local_1098[local_10d0];
      (*av1_calc_indices_dim1)(data,__s1,puVar7,&local_10d8,n,k);
      uVar8 = local_1104;
      if (local_10a0 < local_10d8) goto LAB_001e07e8;
      iVar3 = iVar4 + 1;
      local_1104 = (uint)uVar5;
      iVar4 = max_itr;
    } while (iVar3 != max_itr);
  }
  uVar8 = 0;
LAB_001e07e8:
  uVar9 = (uint)uVar5;
  if (iVar4 != max_itr) {
    uVar9 = uVar8;
  }
  if (uVar9 != 0) {
    memcpy(centroids,local_1088,lVar6 * 2);
    memcpy(indices,local_1038,(long)n);
  }
  return;
}

Assistant:

void RENAME(av1_k_means)(const int16_t *data, int16_t *centroids,
                         uint8_t *indices, int n, int k, int max_itr) {
  int16_t centroids_tmp[AV1_K_MEANS_DIM * PALETTE_MAX_SIZE];
  uint8_t indices_tmp[MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT];
  int16_t *meta_centroids[2] = { centroids, centroids_tmp };
  uint8_t *meta_indices[2] = { indices, indices_tmp };
  int i, l = 0, prev_l, best_l = 0;
  int64_t this_dist;

  assert(n <= MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT);

#if AV1_K_MEANS_DIM == 1
  av1_calc_indices_dim1(data, centroids, indices, &this_dist, n, k);
#else
  av1_calc_indices_dim2(data, centroids, indices, &this_dist, n, k);
#endif

  for (i = 0; i < max_itr; ++i) {
    const int64_t prev_dist = this_dist;
    prev_l = l;
    l = (l == 1) ? 0 : 1;

    RENAME(calc_centroids)(data, meta_centroids[l], meta_indices[prev_l], n, k);
    if (!memcmp(meta_centroids[l], meta_centroids[prev_l],
                sizeof(centroids[0]) * k * AV1_K_MEANS_DIM)) {
      break;
    }
#if AV1_K_MEANS_DIM == 1
    av1_calc_indices_dim1(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#else
    av1_calc_indices_dim2(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#endif

    if (this_dist > prev_dist) {
      best_l = prev_l;
      break;
    }
  }
  if (i == max_itr) best_l = l;
  if (best_l != 0) {
    memcpy(centroids, meta_centroids[1],
           sizeof(centroids[0]) * k * AV1_K_MEANS_DIM);
    memcpy(indices, meta_indices[1], sizeof(indices[0]) * n);
  }
}